

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVLABase<QMutableTouchEvent>::reallocate_impl
          (QVLABase<QMutableTouchEvent> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  QMutableTouchEvent *first;
  long lVar1;
  long lVar2;
  QMutableTouchEvent *out;
  qsizetype n;
  long in_FS_OFFSET;
  qsizetype aalloc_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  first = (QMutableTouchEvent *)(this->super_QVLABaseBase).ptr;
  lVar1 = (this->super_QVLABaseBase).a;
  lVar2 = (this->super_QVLABaseBase).s;
  n = asize;
  if (lVar2 < asize) {
    n = lVar2;
  }
  out = first;
  aalloc_local = aalloc;
  if (lVar1 != aalloc) {
    out = (QMutableTouchEvent *)array;
    if (prealloc < aalloc) {
      out = (QMutableTouchEvent *)QtPrivate::fittedMalloc(0,&aalloc_local,0x50,0);
      prealloc = aalloc_local;
    }
    QtPrivate::q_uninitialized_relocate_n<QMutableTouchEvent,long_long>(first,n,out);
    (this->super_QVLABaseBase).ptr = out;
    (this->super_QVLABaseBase).a = prealloc;
  }
  (this->super_QVLABaseBase).s = n;
  if (asize < lVar2) {
    std::_Destroy_aux<false>::__destroy<QMutableTouchEvent*>(first + asize,first + lVar2);
    out = (QMutableTouchEvent *)(this->super_QVLABaseBase).ptr;
  }
  if ((first != (QMutableTouchEvent *)array) && (first != out)) {
    QtPrivate::sizedFree(first,lVar1 * 0x50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}